

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesTestsUtil.cpp
# Opt level: O2

bool vkt::sparse::isImageSizeSupported
               (InstanceInterface *instance,VkPhysicalDevice physicalDevice,ImageType imageType,
               UVec3 *imageSize)

{
  bool bVar1;
  bool bVar2;
  VkPhysicalDeviceProperties deviceProperties;
  VkPhysicalDeviceProperties VStack_348;
  
  ::vk::getPhysicalDeviceProperties(&VStack_348,instance,physicalDevice);
  switch(imageType) {
  case IMAGE_TYPE_1D:
    bVar1 = imageSize->m_data[0] < VStack_348.limits.maxImageDimension1D;
    bVar2 = imageSize->m_data[0] == VStack_348.limits.maxImageDimension1D;
    goto LAB_006e782c;
  case IMAGE_TYPE_1D_ARRAY:
    if (VStack_348.limits.maxImageDimension1D < imageSize->m_data[0]) {
      return false;
    }
    goto LAB_006e7822;
  case IMAGE_TYPE_2D:
    VStack_348.limits.maxImageDimensionCube = VStack_348.limits.maxImageDimension2D;
    break;
  case IMAGE_TYPE_2D_ARRAY:
    VStack_348.limits.maxImageDimensionCube = VStack_348.limits.maxImageDimension2D;
    goto LAB_006e7817;
  case IMAGE_TYPE_3D:
    if (VStack_348.limits.maxImageDimension3D < imageSize->m_data[0]) {
      return false;
    }
    if (VStack_348.limits.maxImageDimension3D < imageSize->m_data[1]) {
      return false;
    }
    bVar1 = imageSize->m_data[2] < VStack_348.limits.maxImageDimension3D;
    bVar2 = imageSize->m_data[2] == VStack_348.limits.maxImageDimension3D;
    goto LAB_006e782c;
  case IMAGE_TYPE_CUBE:
    break;
  case IMAGE_TYPE_CUBE_ARRAY:
LAB_006e7817:
    if (VStack_348.limits.maxImageDimensionCube < imageSize->m_data[0]) {
      return false;
    }
    if (VStack_348.limits.maxImageDimensionCube < imageSize->m_data[1]) {
      return false;
    }
LAB_006e7822:
    bVar1 = imageSize->m_data[2] < VStack_348.limits.maxImageArrayLayers;
    bVar2 = imageSize->m_data[2] == VStack_348.limits.maxImageArrayLayers;
    goto LAB_006e782c;
  case IMAGE_TYPE_BUFFER:
    return true;
  default:
    goto LAB_006e782f;
  }
  if (VStack_348.limits.maxImageDimensionCube < imageSize->m_data[0]) {
LAB_006e782f:
    return false;
  }
  bVar1 = imageSize->m_data[1] < VStack_348.limits.maxImageDimensionCube;
  bVar2 = imageSize->m_data[1] == VStack_348.limits.maxImageDimensionCube;
LAB_006e782c:
  return bVar1 || bVar2;
}

Assistant:

bool isImageSizeSupported (const InstanceInterface& instance, const VkPhysicalDevice physicalDevice, const ImageType imageType, const tcu::UVec3& imageSize)
{
	const VkPhysicalDeviceProperties deviceProperties = getPhysicalDeviceProperties(instance, physicalDevice);

	switch (imageType)
	{
		case IMAGE_TYPE_1D:
			return	imageSize.x() <= deviceProperties.limits.maxImageDimension1D;
		case IMAGE_TYPE_1D_ARRAY:
			return	imageSize.x() <= deviceProperties.limits.maxImageDimension1D &&
					imageSize.z() <= deviceProperties.limits.maxImageArrayLayers;
		case IMAGE_TYPE_2D:
			return	imageSize.x() <= deviceProperties.limits.maxImageDimension2D &&
					imageSize.y() <= deviceProperties.limits.maxImageDimension2D;
		case IMAGE_TYPE_2D_ARRAY:
			return	imageSize.x() <= deviceProperties.limits.maxImageDimension2D &&
					imageSize.y() <= deviceProperties.limits.maxImageDimension2D &&
					imageSize.z() <= deviceProperties.limits.maxImageArrayLayers;
		case IMAGE_TYPE_CUBE:
			return	imageSize.x() <= deviceProperties.limits.maxImageDimensionCube &&
					imageSize.y() <= deviceProperties.limits.maxImageDimensionCube;
		case IMAGE_TYPE_CUBE_ARRAY:
			return	imageSize.x() <= deviceProperties.limits.maxImageDimensionCube &&
					imageSize.y() <= deviceProperties.limits.maxImageDimensionCube &&
					imageSize.z() <= deviceProperties.limits.maxImageArrayLayers;
		case IMAGE_TYPE_3D:
			return	imageSize.x() <= deviceProperties.limits.maxImageDimension3D &&
					imageSize.y() <= deviceProperties.limits.maxImageDimension3D &&
					imageSize.z() <= deviceProperties.limits.maxImageDimension3D;
		case IMAGE_TYPE_BUFFER:
			return true;
		default:
			DE_FATAL("Unknown image type");
			return false;
	}
}